

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O0

DdNode * Llb_ManConstructQuantCubeFwd(Llb_Man_t *p,Llb_Grp_t *pGroup,int iGrpPlace)

{
  abctime aVar1;
  Vec_Int_t *pVVar2;
  DdManager *pDVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  DdNode *pDVar6;
  abctime TimeStop;
  int iGroupLast;
  int i;
  DdNode *bVar;
  DdNode *bTemp;
  DdNode *bRes;
  Aig_Obj_t *pObj;
  int iGrpPlace_local;
  Llb_Grp_t *pGroup_local;
  Llb_Man_t *p_local;
  
  aVar1 = p->dd->TimeStop;
  p->dd->TimeStop = 0;
  bTemp = Cudd_ReadOne(p->dd);
  Cudd_Ref(bTemp);
  for (TimeStop._4_4_ = 0; iVar4 = Vec_PtrSize(pGroup->vIns), TimeStop._4_4_ < iVar4;
      TimeStop._4_4_ = TimeStop._4_4_ + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pGroup->vIns,TimeStop._4_4_);
    pVVar2 = p->vVarEnds;
    iVar4 = Aig_ObjId(pAVar5);
    iVar4 = Vec_IntEntry(pVVar2,iVar4);
    if (iVar4 < iGrpPlace) {
      __assert_fail("iGroupLast >= iGrpPlace",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Reach.c"
                    ,0xd8,"DdNode *Llb_ManConstructQuantCubeFwd(Llb_Man_t *, Llb_Grp_t *, int)");
    }
    if (iVar4 <= iGrpPlace) {
      pDVar3 = p->dd;
      pVVar2 = p->vObj2Var;
      iVar4 = Aig_ObjId(pAVar5);
      iVar4 = Vec_IntEntry(pVVar2,iVar4);
      pDVar6 = Cudd_bddIthVar(pDVar3,iVar4);
      pDVar6 = Cudd_bddAnd(p->dd,bTemp,pDVar6);
      Cudd_Ref(pDVar6);
      Cudd_RecursiveDeref(p->dd,bTemp);
      bTemp = pDVar6;
    }
  }
  TimeStop._4_4_ = 0;
  while( true ) {
    iVar4 = Vec_PtrSize(pGroup->vOuts);
    if (iVar4 <= TimeStop._4_4_) {
      Cudd_Deref(bTemp);
      p->dd->TimeStop = aVar1;
      return bTemp;
    }
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pGroup->vOuts,TimeStop._4_4_);
    pVVar2 = p->vVarEnds;
    iVar4 = Aig_ObjId(pAVar5);
    iVar4 = Vec_IntEntry(pVVar2,iVar4);
    if (iVar4 < iGrpPlace) break;
    if (iVar4 <= iGrpPlace) {
      pDVar3 = p->dd;
      pVVar2 = p->vObj2Var;
      iVar4 = Aig_ObjId(pAVar5);
      iVar4 = Vec_IntEntry(pVVar2,iVar4);
      pDVar6 = Cudd_bddIthVar(pDVar3,iVar4);
      pDVar6 = Cudd_bddAnd(p->dd,bTemp,pDVar6);
      Cudd_Ref(pDVar6);
      Cudd_RecursiveDeref(p->dd,bTemp);
      bTemp = pDVar6;
    }
    TimeStop._4_4_ = TimeStop._4_4_ + 1;
  }
  __assert_fail("iGroupLast >= iGrpPlace",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Reach.c"
                ,0xe2,"DdNode *Llb_ManConstructQuantCubeFwd(Llb_Man_t *, Llb_Grp_t *, int)");
}

Assistant:

DdNode * Llb_ManConstructQuantCubeFwd( Llb_Man_t * p, Llb_Grp_t * pGroup, int iGrpPlace )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bTemp, * bVar;
    int i, iGroupLast;
    abctime TimeStop;
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    bRes = Cudd_ReadOne( p->dd );   Cudd_Ref( bRes );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
    {
        iGroupLast = Vec_IntEntry(p->vVarEnds, Aig_ObjId(pObj));
        assert( iGroupLast >= iGrpPlace );
        if ( iGroupLast > iGrpPlace )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
    {
        iGroupLast = Vec_IntEntry(p->vVarEnds, Aig_ObjId(pObj));
        assert( iGroupLast >= iGrpPlace );
        if ( iGroupLast > iGrpPlace )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Cudd_Deref( bRes );
    p->dd->TimeStop = TimeStop;
    return bRes;
}